

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O3

void Handler_bouncetype_S_Actor(AActor *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  byte *pbVar1;
  char *__s1;
  undefined2 uVar2;
  int iVar3;
  char *__s2;
  long lVar4;
  
  __s1 = params[1].s;
  __s2 = "None";
  lVar4 = 0;
  do {
    iVar3 = strcasecmp(__s1,__s2);
    if (iVar3 == 0) goto LAB_0051b8e6;
    __s2 = Handler_bouncetype_S_Actor::names[lVar4 + 1];
    lVar4 = lVar4 + 1;
  } while (__s2 != (char *)0x0);
  lVar4 = 0;
  I_Error("Unknown bouncetype %s",__s1);
LAB_0051b8e6:
  uVar2 = (defaults->BounceFlags).Value & 0xef10 | (short)Handler_bouncetype_S_Actor::flags[lVar4];
  (defaults->BounceFlags).Value = uVar2;
  if ((uVar2 & (BOUNCE_AllActors|BOUNCE_Actors)) != BOUNCE_None) {
    pbVar1 = (byte *)((long)&(defaults->flags2).Value + 1);
    *pbVar1 = *pbVar1 | 0x10;
  }
  return;
}

Assistant:

DEFINE_PROPERTY(bouncetype, S, Actor)
{
	static const char *names[] = { "None", "Doom", "Heretic", "Hexen", "DoomCompat", "HereticCompat", "HexenCompat", "Grenade", "Classic", NULL };
	static const ActorBounceFlag flags[] = { BOUNCE_None,
		BOUNCE_Doom, BOUNCE_Heretic, BOUNCE_Hexen,
		BOUNCE_DoomCompat, BOUNCE_HereticCompat, BOUNCE_HexenCompat,
		BOUNCE_Grenade, BOUNCE_Classic, };
	PROP_STRING_PARM(id, 0);
	int match = MatchString(id, names);
	if (match < 0)
	{
		I_Error("Unknown bouncetype %s", id);
		match = 0;
	}
	defaults->BounceFlags &= ~(BOUNCE_TypeMask | BOUNCE_UseSeeSound);
	defaults->BounceFlags |= flags[match];
	if (defaults->BounceFlags & (BOUNCE_Actors | BOUNCE_AllActors))
	{
		// PASSMOBJ is irrelevant for normal missiles, but not for bouncers.
		defaults->flags2 |= MF2_PASSMOBJ;
	}
}